

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# about_impl.cpp
# Opt level: O1

Element __thiscall ui::AboutImpl::Render(AboutImpl *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long lVar2;
  Element EVar3;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_00;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_01;
  undefined8 uStack_118;
  shared_ptr<ftxui::Node> local_110;
  ftxui local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [64];
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_a0;
  code *local_88;
  undefined1 auStack_80 [16];
  code *pcStack_70;
  undefined8 uStack_68;
  shared_ptr<ftxui::Node> local_60 [2];
  ftxui local_40 [16];
  
  ftxui::filler();
  ftxui::filler();
  RenderBackground((AboutImpl *)local_e0);
  auStack_80._0_8_ = 0;
  local_88 = ftxui::hcenter;
  pcStack_70 = std::
               _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
               ::_M_invoke;
  auStack_80._8_8_ =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
       ::_M_manager;
  ftxui::operator|(local_40,(Element *)local_e0,(Decorator *)&local_88);
  __l._M_len = 3;
  __l._M_array = local_60;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            ((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )(local_e0 + 0x28),__l,(allocator_type *)((long)&uStack_118 + 7));
  ftxui::vbox((ftxui *)&local_110,(Elements *)(local_e0 + 0x28));
  RenderForeground((AboutImpl *)local_f0);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_f0;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            ((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )(local_e0 + 0x10),__l_00,(allocator_type *)((long)&uStack_118 + 6));
  ftxui::vbox(local_100,(Elements *)(local_e0 + 0x10));
  __l_01._M_len = 2;
  __l_01._M_array = &local_110;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_a0,__l_01,(allocator_type *)((long)&uStack_118 + 5));
  ftxui::dbox((ftxui *)this,&local_a0);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_a0);
  lVar2 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_118 + lVar2) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_118 + lVar2));
    }
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            ((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )(local_e0 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
  }
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            ((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )(local_e0 + 0x28));
  lVar2 = 0x30;
  _Var1._M_pi = extraout_RDX;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_68 + lVar2) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_68 + lVar2));
      _Var1._M_pi = extraout_RDX_00;
    }
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0);
  if ((code *)auStack_80._8_8_ != (code *)0x0) {
    (*(code *)auStack_80._8_8_)(&local_88,&local_88,3);
    _Var1._M_pi = extraout_RDX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
    _Var1._M_pi = extraout_RDX_02;
  }
  EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    return dbox({
        vbox({
            filler(),
            filler(),
            RenderBackground() | hcenter,
        }),
        vbox({
            RenderForeground(),
        }),
    });
  }